

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::remove
          (QList<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *this,char *__filename)

{
  QList<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **in_stack_00000018;
  QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *in_stack_00000020;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>
  *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::detach
              (&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::operator->(&this->d);
    QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::operator->(&this->d);
    QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::begin
              ((QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)0x960c29)
    ;
    QtPrivate::QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}